

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O1

SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)

{
  char cVar1;
  char cVar2;
  SQRexNode *pSVar3;
  int iVar4;
  SQInteger SVar5;
  SQChar **ppSVar6;
  char *pcVar7;
  int type;
  
  pcVar7 = exp->_p;
  type = (int)*pcVar7;
  if (type != 0x5c) {
    iVar4 = isprint(type);
    if (iVar4 != 0) {
      exp->_p = pcVar7 + 1;
      goto LAB_001086f3;
    }
    ppSVar6 = exp->_error;
    if (ppSVar6 == (SQChar **)0x0) goto LAB_0010881d;
    pcVar7 = "letter expected";
LAB_0010881a:
    *ppSVar6 = pcVar7;
LAB_0010881d:
    longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
  }
  exp->_p = pcVar7 + 1;
  cVar1 = pcVar7[1];
  switch(cVar1) {
  case 'A':
  case 'C':
  case 'D':
  case 'P':
  case 'S':
  case 'W':
  case 'X':
  case 'a':
  case 'c':
  case 'd':
  case 'l':
  case 'p':
  case 's':
  case 'u':
  case 'w':
  case 'x':
    exp->_p = pcVar7 + 2;
    SVar5 = sqstd_rex_newnode(exp,0x106);
    exp->_nodes[SVar5].left = (long)cVar1;
    return SVar5;
  case 'B':
  case 'b':
    if (isclass == 0) {
      SVar5 = sqstd_rex_newnode(exp,0x10c);
      pcVar7 = exp->_p;
      exp->_nodes[SVar5].left = (long)*pcVar7;
      exp->_p = pcVar7 + 1;
      return SVar5;
    }
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'Q':
  case 'R':
  case 'T':
  case 'U':
  case 'V':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'e':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'o':
  case 'q':
switchD_001086a6_caseD_45:
    exp->_p = pcVar7 + 2;
    type = (int)cVar1;
    break;
  case 'f':
    exp->_p = pcVar7 + 2;
    type = 0xc;
    break;
  case 'm':
    exp->_p = pcVar7 + 2;
    cVar1 = pcVar7[2];
    exp->_p = pcVar7 + 3;
    cVar2 = pcVar7[3];
    exp->_p = pcVar7 + 4;
    if (((long)cVar1 == 0) || (cVar2 == '\0')) {
      ppSVar6 = exp->_error;
      if (ppSVar6 == (SQChar **)0x0) goto LAB_0010881d;
      pcVar7 = "balanced chars expected";
    }
    else {
      if (cVar1 != cVar2) {
        SVar5 = sqstd_rex_newnode(exp,0x10d);
        pSVar3 = exp->_nodes;
        pSVar3[SVar5].left = (long)cVar1;
        pSVar3[SVar5].right = (long)cVar2;
        return SVar5;
      }
      ppSVar6 = exp->_error;
      if (ppSVar6 == (SQChar **)0x0) goto LAB_0010881d;
      pcVar7 = "open/close char can\'t be the same";
    }
    goto LAB_0010881a;
  case 'n':
    exp->_p = pcVar7 + 2;
    type = 10;
    break;
  case 'r':
    exp->_p = pcVar7 + 2;
    type = 0xd;
    break;
  case 't':
    exp->_p = pcVar7 + 2;
    type = 9;
    break;
  case 'v':
    exp->_p = pcVar7 + 2;
    type = 0xb;
    break;
  default:
    if (cVar1 == '\0') {
      ppSVar6 = exp->_error;
      if (ppSVar6 == (SQChar **)0x0) goto LAB_0010881d;
      pcVar7 = "letter expected for argument of escape sequence";
      goto LAB_0010881a;
    }
    goto switchD_001086a6_caseD_45;
  }
LAB_001086f3:
  SVar5 = sqstd_rex_newnode(exp,type);
  return SVar5;
}

Assistant:

static SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)
{
    SQChar t;
    if(*exp->_p == SQREX_SYMBOL_ESCAPE_CHAR) {
        exp->_p++;
        switch(*exp->_p) {
            case 'n': exp->_p++; return sqstd_rex_newnode(exp,'\n');
            case 't': exp->_p++; return sqstd_rex_newnode(exp,'\t');
            case 'r': exp->_p++; return sqstd_rex_newnode(exp,'\r');
            case 'f': exp->_p++; return sqstd_rex_newnode(exp,'\f');
            case 'v': exp->_p++; return sqstd_rex_newnode(exp,'\v');
            case 'a': case 'A': case 'w': case 'W': case 's': case 'S':
            case 'd': case 'D': case 'x': case 'X': case 'c': case 'C':
            case 'p': case 'P': case 'l': case 'u':
                {
                t = *exp->_p; exp->_p++;
                return sqstd_rex_charclass(exp,t);
                }
            case 'm':
                {
                     SQChar cb, ce; //cb = character begin match ce = character end match
                     cb = *++exp->_p; //skip 'm'
                     ce = *++exp->_p;
                     exp->_p++; //points to the next char to be parsed
                     if ((!cb) || (!ce)) sqstd_rex_error(exp,_SC("balanced chars expected"));
                     if ( cb == ce ) sqstd_rex_error(exp,_SC("open/close char can't be the same"));
                     SQInteger node =  sqstd_rex_newnode(exp,OP_MB);
                     exp->_nodes[node].left = cb;
                     exp->_nodes[node].right = ce;
                     return node;
                }
            case 0:
                sqstd_rex_error(exp,_SC("letter expected for argument of escape sequence"));
                break;
            case 'b':
            case 'B':
                if(!isclass) {
                    SQInteger node = sqstd_rex_newnode(exp,OP_WB);
                    exp->_nodes[node].left = *exp->_p;
                    exp->_p++;
                    return node;
                } //else default
            default:
                t = *exp->_p; exp->_p++;
                return sqstd_rex_newnode(exp,t);
        }
    }
    else if(!scisprint(*exp->_p)) {

        sqstd_rex_error(exp,_SC("letter expected"));
    }
    t = *exp->_p; exp->_p++;
    return sqstd_rex_newnode(exp,t);
}